

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

FxExpression * __thiscall FxIntCast::Resolve(FxIntCast *this,FCompileContext *ctx)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  char *pcVar3;
  anon_union_8_3_addc324a_for_ExpVal_1 this_00;
  FxConstant *this_01;
  FxExpression *x_2;
  ExpVal constval;
  FxExpression *x_1;
  undefined1 local_40 [32];
  FxExpression *x;
  FCompileContext *ctx_local;
  FxIntCast *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    x = (FxExpression *)ctx;
    ctx_local = (FCompileContext *)this;
    if (this->basex != (FxExpression *)0x0) {
      iVar1 = (*this->basex->_vptr_FxExpression[2])(this->basex,ctx);
      this->basex = (FxExpression *)CONCAT44(extraout_var,iVar1);
    }
    if (this->basex == (FxExpression *)0x0) {
      if (this != (FxIntCast *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxIntCast *)0x0;
    }
    else {
      iVar1 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])();
      if (iVar1 == 0) {
        if (this->basex->ValueType == (PType *)TypeName) {
          uVar2 = (*this->basex->_vptr_FxExpression[3])();
          if ((uVar2 & 1) == 0) {
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,3,
                       "Numeric type expected, got a name");
          }
          else {
            FxConstant::GetValue((FxConstant *)local_40);
            ExpVal::GetName((ExpVal *)(local_40 + 0x14));
            pcVar3 = FName::GetChars((FName *)(local_40 + 0x14));
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,3,
                       "Numeric type expected, got \"%s\"",pcVar3);
            ExpVal::~ExpVal((ExpVal *)local_40);
          }
          this_00.pointer = operator_new(0x48);
          FxConstant::FxConstant
                    ((FxConstant *)this_00.pointer,0,&(this->super_FxExpression).ScriptPosition);
          constval.field_1.pointer = this_00.pointer;
          if (this != (FxIntCast *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = (FxIntCast *)constval.field_1.pointer;
        }
        else {
          local_40._24_8_ = this->basex;
          this->basex = (FxExpression *)0x0;
          if (this != (FxIntCast *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = (FxIntCast *)local_40._24_8_;
        }
      }
      else {
        iVar1 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])();
        if (iVar1 == 1) {
          uVar2 = (*this->basex->_vptr_FxExpression[3])();
          if ((uVar2 & 1) != 0) {
            FxConstant::GetValue((FxConstant *)&x_2);
            this_01 = (FxConstant *)operator_new(0x48);
            iVar1 = ExpVal::GetInt((ExpVal *)&x_2);
            FxConstant::FxConstant(this_01,iVar1,&(this->super_FxExpression).ScriptPosition);
            if (this != (FxIntCast *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            this_local = (FxIntCast *)this_01;
            ExpVal::~ExpVal((ExpVal *)&x_2);
          }
        }
        else {
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
          if (this != (FxIntCast *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = (FxIntCast *)0x0;
        }
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxIntCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType->GetRegType() == REGT_INT)
	{
		if (basex->ValueType != TypeName)
		{
			FxExpression *x = basex;
			basex = NULL;
			delete this;
			return x;
		}
		else
		{
			// Ugh. This should abort, but too many mods fell into this logic hole somewhere, so this seroious error needs to be reduced to a warning. :(
			if (!basex->isConstant())	ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got a name");
			else ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got \"%s\"", static_cast<FxConstant*>(basex)->GetValue().GetName().GetChars());
			FxExpression * x = new FxConstant(0, ScriptPosition);
			delete this;
			return x;
		}
	}
	else if (basex->ValueType->GetRegType() == REGT_FLOAT)
	{
		if (basex->isConstant())
		{
			ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
			FxExpression *x = new FxConstant(constval.GetInt(), ScriptPosition);
			delete this;
			return x;
		}
		return this;
	}
	ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
	delete this;
	return NULL;
}